

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

float __thiscall TPZMatrix<float>::GetRandomVal(TPZMatrix<float> *this)

{
  int iVar1;
  result_type rVar2;
  float a_random;
  type_conflict upper_bound;
  type_conflict lower_bound;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (GetRandomVal()::unif == '\0') {
    iVar1 = __cxa_guard_acquire(&GetRandomVal()::unif);
    if (iVar1 != 0) {
      std::uniform_real_distribution<float>::uniform_real_distribution
                ((uniform_real_distribution<float> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
      __cxa_guard_release(&GetRandomVal()::unif);
    }
  }
  if (GetRandomVal()::re == '\0') {
    iVar1 = __cxa_guard_acquire(&GetRandomVal()::re);
    if (iVar1 != 0) {
      std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
      linear_congruential_engine
                ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x12f6d0b)
      ;
      __cxa_guard_release(&GetRandomVal()::re);
    }
  }
  rVar2 = std::uniform_real_distribution<float>::operator()
                    ((uniform_real_distribution<float> *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  return rVar2;
}

Assistant:

TVar TPZMatrix<TVar>::GetRandomVal() const{

    if constexpr (std::is_integral_v<TVar> ||
                  std::is_same_v<TVar,TPZFlopCounter>){
        return  ((TVar) rand())/((TVar)RAND_MAX);
    }
    
    else if constexpr (is_fad<TVar>::value){
      constexpr typename TVar::value_type lower_bound = 0;
      constexpr typename TVar::value_type upper_bound = 1;
      static std::uniform_real_distribution<typename TVar::value_type>
        unif(lower_bound,upper_bound);
      static std::default_random_engine re;
      TVar a_random = (TVar)unif(re);
      if constexpr (is_complex<TVar>::value){
        a_random+= (TVar)1i * (TVar)unif(re);
      }
      return a_random;
    }else{
        constexpr RTVar lower_bound = 0;
        constexpr RTVar upper_bound = 1;
        static std::uniform_real_distribution<RTVar> unif(lower_bound,upper_bound);
        static std::default_random_engine re;
        TVar a_random = (TVar)unif(re);
        if constexpr (is_complex<TVar>::value){
            a_random+= (TVar)1i * (TVar)unif(re);
        }
        return a_random;
    }
}